

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_options.hxx
# Opt level: O2

void __thiscall
nuraft::asio_service_options::asio_service_options
          (asio_service_options *this,asio_service_options *param_1)

{
  bool bVar1;
  
  this->thread_pool_size_ = param_1->thread_pool_size_;
  std::function<void_(unsigned_int)>::function(&this->worker_start_,&param_1->worker_start_);
  std::function<void_(unsigned_int)>::function(&this->worker_stop_,&param_1->worker_stop_);
  bVar1 = param_1->skip_verification_;
  this->enable_ssl_ = param_1->enable_ssl_;
  this->skip_verification_ = bVar1;
  std::__cxx11::string::string
            ((string *)&this->server_cert_file_,(string *)&param_1->server_cert_file_);
  std::__cxx11::string::string
            ((string *)&this->server_key_file_,(string *)&param_1->server_key_file_);
  std::__cxx11::string::string((string *)&this->root_cert_file_,(string *)&param_1->root_cert_file_)
  ;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
  ::function(&this->write_req_meta_,&param_1->write_req_meta_);
  std::
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->read_req_meta_,&param_1->read_req_meta_);
  this->invoke_req_cb_on_empty_meta_ = param_1->invoke_req_cb_on_empty_meta_;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
  ::function(&this->write_resp_meta_,&param_1->write_resp_meta_);
  std::
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->read_resp_meta_,&param_1->read_resp_meta_);
  this->invoke_resp_cb_on_empty_meta_ = param_1->invoke_resp_cb_on_empty_meta_;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->verify_sn_,&param_1->verify_sn_);
  std::function<ssl_ctx_st_*()>::function
            (&this->ssl_context_provider_server_,&param_1->ssl_context_provider_server_);
  std::function<ssl_ctx_st_*()>::function
            (&this->ssl_context_provider_client_,&param_1->ssl_context_provider_client_);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
  ::function(&this->custom_resolver_,&param_1->custom_resolver_);
  this->replicate_log_timestamp_ = param_1->replicate_log_timestamp_;
  return;
}

Assistant:

asio_service_options()
        : thread_pool_size_(0)
        , worker_start_(nullptr)
        , worker_stop_(nullptr)
        , enable_ssl_(false)
        , skip_verification_(false)
        , write_req_meta_(nullptr)
        , read_req_meta_(nullptr)
        , invoke_req_cb_on_empty_meta_(true)
        , write_resp_meta_(nullptr)
        , read_resp_meta_(nullptr)
        , invoke_resp_cb_on_empty_meta_(true)
        , verify_sn_(nullptr)
        , custom_resolver_(nullptr)
        , replicate_log_timestamp_(false)
        {}